

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Channel.cpp
# Opt level: O0

void __thiscall sznet::net::Channel::handleEventWithGuard(Channel *this,Timestamp receiveTime)

{
  bool bVar1;
  LogLevel LVar2;
  LogStream *pLVar3;
  self *psVar4;
  SourceFile file;
  SourceFile file_00;
  SourceFile file_01;
  undefined1 local_2fe8 [12];
  Logger local_2fd8;
  undefined1 local_2008 [12];
  Logger local_1ff8;
  undefined1 local_1028 [48];
  SourceFile local_ff8;
  Logger local_fe8;
  Channel *local_18;
  Channel *this_local;
  Timestamp receiveTime_local;
  
  this->m_eventHandling = true;
  local_18 = this;
  this_local = (Channel *)receiveTime.m_microSecondsSinceEpoch;
  LVar2 = Logger::logLevel();
  if ((int)LVar2 < 1) {
    Logger::SourceFile::SourceFile<98>
              (&local_ff8,
               (char (*) [98])
               "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/sznet/net/Channel.cpp"
              );
    file._12_4_ = 0;
    file.m_data = local_ff8.m_data;
    file.m_size = local_ff8.m_size;
    Logger::Logger(&local_fe8,file,0x4c,TRACE,"handleEventWithGuard");
    pLVar3 = Logger::stream(&local_fe8);
    reventsToString_abi_cxx11_((Channel *)local_1028);
    LogStream::operator<<(pLVar3,(string *)local_1028);
    std::__cxx11::string::~string((string *)local_1028);
    Logger::~Logger(&local_fe8);
  }
  if (((this->m_revents & 0x20) != 0) && ((this->m_revents & 1) == 0)) {
    if ((this->m_logHup & 1U) != 0) {
      Logger::SourceFile::SourceFile<98>
                ((SourceFile *)local_2008,
                 (char (*) [98])
                 "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/sznet/net/Channel.cpp"
                );
      file_00._12_4_ = 0;
      file_00.m_data = (char *)local_2008._0_8_;
      file_00.m_size = local_2008._8_4_;
      Logger::Logger(&local_1ff8,file_00,0x52,WARN);
      pLVar3 = Logger::stream(&local_1ff8);
      psVar4 = LogStream::operator<<(pLVar3,"fd = ");
      pLVar3 = LogStream::operator<<(psVar4,this->m_fd);
      LogStream::operator<<(pLVar3," Channel::handle_event() kHupEvent");
      Logger::~Logger(&local_1ff8);
    }
    bVar1 = std::function::operator_cast_to_bool((function *)&this->m_closeCallback);
    if (bVar1) {
      std::function<void_()>::operator()(&this->m_closeCallback);
    }
  }
  if ((this->m_revents & 0x40) != 0) {
    Logger::SourceFile::SourceFile<98>
              ((SourceFile *)local_2fe8,
               (char (*) [98])
               "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/sznet/net/Channel.cpp"
              );
    file_01._12_4_ = 0;
    file_01.m_data = (char *)local_2fe8._0_8_;
    file_01.m_size = local_2fe8._8_4_;
    Logger::Logger(&local_2fd8,file_01,0x5e,WARN);
    pLVar3 = Logger::stream(&local_2fd8);
    psVar4 = LogStream::operator<<(pLVar3,"fd = ");
    pLVar3 = LogStream::operator<<(psVar4,this->m_fd);
    LogStream::operator<<(pLVar3," Channel::handle_event() KNvalEvent");
    Logger::~Logger(&local_2fd8);
  }
  if (((this->m_revents & 0x50) != 0) &&
     (bVar1 = std::function::operator_cast_to_bool((function *)&this->m_errorCallback), bVar1)) {
    std::function<void_()>::operator()(&this->m_errorCallback);
  }
  if (((this->m_revents & 7) != 0) &&
     (bVar1 = std::function::operator_cast_to_bool((function *)&this->m_readCallback), bVar1)) {
    std::function<void_(sznet::Timestamp)>::operator()(&this->m_readCallback,(Timestamp)this_local);
  }
  if (((this->m_revents & 8) != 0) &&
     (bVar1 = std::function::operator_cast_to_bool((function *)&this->m_writeCallback), bVar1)) {
    std::function<void_()>::operator()(&this->m_writeCallback);
  }
  this->m_eventHandling = false;
  return;
}

Assistant:

void Channel::handleEventWithGuard(Timestamp receiveTime)
{
	// 事件处理时，设置下此状态
	// Channel析构时，用到此状态 
	m_eventHandling = true;
	LOG_TRACE << reventsToString();
	// RCV_SHUTDOWN | SEND_SHUTDOWN
	if ((m_revents & kHupEvent) && !(m_revents & kReadEvent))
	{
		if (m_logHup)
		{
			LOG_WARN << "fd = " << m_fd << " Channel::handle_event() kHupEvent";
		}
		if (m_closeCallback)
		{
			m_closeCallback();
		}
	}

	// A POLLNVAL means the socket file descriptor is not open. 
	// It would be an error to close() it.
	if (m_revents & kNvalEvent)
	{
		LOG_WARN << "fd = " << m_fd << " Channel::handle_event() KNvalEvent";
	}

	// A POLLERR means error condition happened on the associated file descriptor.
	if (m_revents & (kErrorEvent | kNvalEvent))
	{
		if (m_errorCallback)
		{
			m_errorCallback();
		}
	}

	// 读事件
	if (m_revents & (kReadEvent | kPriEvent | kRdHupEvent))
	{
		if (m_readCallback)
		{
			m_readCallback(receiveTime);
		}
	}

	// 写事件
	if (m_revents & kWriteEvent)
	{
		if (m_writeCallback)
		{
			m_writeCallback();
		}
	}

	m_eventHandling = false;
}